

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O1

Vec_Int_t * Acb_NtkFindRoots(Acb_Ntk_t *p,Vec_Int_t *vTargets,Vec_Bit_t **pvBlock)

{
  uint uVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  Vec_Bit_t *vBlock;
  long lVar3;
  int iVar4;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar2 = (int *)malloc(4000);
  p_00->pArray = piVar2;
  uVar1 = (p->vObjType).nSize - 1;
  iVar4 = (((int)uVar1 >> 5) + 1) - (uint)((uVar1 & 0x1f) == 0);
  vBlock = (Vec_Bit_t *)malloc(0x10);
  vBlock->nSize = 0;
  vBlock->nCap = iVar4 * 0x20;
  if (iVar4 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar4 * 4);
  }
  vBlock->pArray = piVar2;
  vBlock->nSize = iVar4 * 0x20;
  memset(piVar2,0,(long)iVar4 << 2);
  *pvBlock = vBlock;
  if ((p->vObjTrav).nSize < 1) {
    uVar1 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar1) {
      piVar2 = (p->vObjTrav).pArray;
      if (piVar2 == (int *)0x0) {
        piVar2 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar2 = (int *)realloc(piVar2,(long)(int)uVar1 << 2);
      }
      (p->vObjTrav).pArray = piVar2;
      if (piVar2 == (int *)0x0) goto LAB_00393edc;
      (p->vObjTrav).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar1 * 4);
    }
    (p->vObjTrav).nSize = uVar1;
  }
  p->nObjTravs = p->nObjTravs + 1;
  if (vTargets->nSize < 1) {
    __assert_fail("Vec_IntSize(vTargets) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                  ,0x200,"Vec_Int_t *Acb_NtkFindRoots(Acb_Ntk_t *, Vec_Int_t *, Vec_Bit_t **)");
  }
  if (0 < vTargets->nSize) {
    piVar2 = vTargets->pArray;
    lVar3 = 0;
    do {
      uVar1 = piVar2[lVar3];
      if (((long)(int)uVar1 < 0) || ((p->vObjTrav).nSize <= (int)uVar1)) goto LAB_00393e22;
      (p->vObjTrav).pArray[(int)uVar1] = p->nObjTravs;
      if (vBlock->nSize <= (int)uVar1) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                      ,0x132,"void Vec_BitWriteEntry(Vec_Bit_t *, int, int)");
      }
      vBlock->pArray[uVar1 >> 5] = vBlock->pArray[uVar1 >> 5] | 1 << ((byte)uVar1 & 0x1f);
      lVar3 = lVar3 + 1;
    } while (lVar3 < vTargets->nSize);
  }
  if ((p->vObjTrav).nSize < 1) {
    uVar1 = (p->vObjType).nCap;
    if ((p->vObjTrav).nCap < (int)uVar1) {
      piVar2 = (p->vObjTrav).pArray;
      if (piVar2 == (int *)0x0) {
        piVar2 = (int *)malloc((long)(int)uVar1 << 2);
      }
      else {
        piVar2 = (int *)realloc(piVar2,(long)(int)uVar1 << 2);
      }
      (p->vObjTrav).pArray = piVar2;
      if (piVar2 == (int *)0x0) {
LAB_00393edc:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vObjTrav).nCap = uVar1;
    }
    if (0 < (int)uVar1) {
      memset((p->vObjTrav).pArray,0,(ulong)uVar1 * 4);
    }
    (p->vObjTrav).nSize = uVar1;
  }
  p->nObjTravs = p->nObjTravs + 1;
  if (0 < (p->vCis).nSize) {
    piVar2 = (p->vCis).pArray;
    lVar3 = 0;
    do {
      iVar4 = piVar2[lVar3];
      if (((long)iVar4 < 0) || ((p->vObjTrav).nSize <= iVar4)) goto LAB_00393e22;
      (p->vObjTrav).pArray[iVar4] = p->nObjTravs;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (p->vCis).nSize);
  }
  if (1 < (p->vObjType).nSize) {
    lVar3 = 1;
    do {
      if ((p->vObjType).nSize <= lVar3) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                      ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
      }
      uVar1 = (uint)(byte)(p->vObjType).pArray[lVar3];
      if ((4 < uVar1) || ((0x19U >> (uVar1 & 0x1f) & 1) == 0)) {
        Acb_NtkFindRoots_rec(p,(int)lVar3,vBlock);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (p->vObjType).nSize);
  }
  if (0 < (p->vCos).nSize) {
    lVar3 = 0;
    do {
      iVar4 = (p->vCos).pArray[lVar3];
      if ((long)iVar4 < 1) {
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((p->vObjFans).nSize <= iVar4) {
LAB_00393e22:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar4 = (p->vObjFans).pArray[iVar4];
      if (((long)iVar4 < 0) || ((p->vFanSto).nSize <= iVar4)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      iVar4 = Acb_NtkFindRoots_rec(p,(p->vFanSto).pArray[(long)iVar4 + 1],vBlock);
      if (iVar4 != 0) {
        Vec_IntPush(p_00,(int)lVar3);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 < (p->vCos).nSize);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Acb_NtkFindRoots( Acb_Ntk_t * p, Vec_Int_t * vTargets, Vec_Bit_t ** pvBlock )
{
    int i, iObj;
    Vec_Int_t * vRoots = Vec_IntAlloc( 1000 );
    Vec_Bit_t * vBlock = Vec_BitStart( Acb_NtkObjNum(p) );
    *pvBlock = vBlock;
    // mark targets
    Acb_NtkIncTravId( p );
    assert( Vec_IntSize(vTargets) > 0 );
    Vec_IntForEachEntry( vTargets, iObj, i )
    {
        Acb_ObjSetTravIdCur( p, iObj );
        Vec_BitWriteEntry( vBlock, iObj, 1 );
    }
    // mark inputs
    Acb_NtkIncTravId( p );
    Acb_NtkForEachCi( p, iObj, i )
        Acb_ObjSetTravIdCur( p, iObj );
    // visit internal nodes
    Acb_NtkForEachNode( p, iObj )
        Acb_NtkFindRoots_rec(p, iObj, vBlock);
    // collect outputs reachable from targets
    Acb_NtkForEachCoDriver( p, iObj, i )
        if ( Acb_NtkFindRoots_rec(p, iObj, vBlock) )
            Vec_IntPush( vRoots, i );
    //Vec_IntPrint( vRoots );
    return vRoots;
}